

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

void Gia_ManCleanupRemap(Gia_Man_t *p,Gia_Man_t *pGia)

{
  uint Lit;
  int iVar1;
  int v;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_2c;
  int iPrev;
  int i;
  Gia_Obj_t *pObjGia;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia_local;
  Gia_Man_t *p_local;
  
  local_2c = 1;
  while( true ) {
    bVar3 = false;
    if (local_2c < p->nObjs) {
      pObjGia = Gia_ManObj(p,local_2c);
      bVar3 = pObjGia != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjValue(pObjGia);
    if (iVar1 != -1) {
      v = Abc_Lit2Var(iVar1);
      pGVar2 = Gia_ManObj(pGia,v);
      if (pGVar2->Value == 0xffffffff) {
        Gia_ObjSetValue(pObjGia,pGVar2->Value);
      }
      else {
        Lit = pGVar2->Value;
        iVar1 = Abc_LitIsCompl(iVar1);
        iVar1 = Abc_LitNotCond(Lit,iVar1);
        Gia_ObjSetValue(pObjGia,iVar1);
      }
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Gia_ManCleanupRemap( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj, * pObjGia;
    int i, iPrev;
    Gia_ManForEachObj1( p, pObj, i )
    {
        iPrev = Gia_ObjValue(pObj);
        if ( iPrev == ~0 )
            continue;
        pObjGia = Gia_ManObj( pGia, Abc_Lit2Var(iPrev) );
        if ( pObjGia->Value == ~0 )
            Gia_ObjSetValue( pObj, pObjGia->Value ); 
        else
            Gia_ObjSetValue( pObj, Abc_LitNotCond(pObjGia->Value, Abc_LitIsCompl(iPrev)) );
    }
}